

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_crypt.c
# Opt level: O0

int gost_cipher_do_cnt(EVP_CIPHER_CTX *ctx,uchar *out,uchar *in,size_t inl)

{
  int iVar1;
  uchar *buf_00;
  void *in_RCX;
  byte *in_RDX;
  byte *in_RSI;
  undefined8 in_RDI;
  uchar *iv;
  uchar *buf;
  size_t j;
  size_t i;
  uchar *out_ptr;
  uchar *in_ptr;
  uchar *in_stack_ffffffffffffffb8;
  ulong uVar2;
  void *ctx_00;
  byte *local_38;
  byte *local_30;
  
  ctx_00 = (void *)0x0;
  buf_00 = (uchar *)EVP_CIPHER_CTX_buf_noconst(in_RDI);
  EVP_CIPHER_CTX_iv_noconst(in_RDI);
  iVar1 = EVP_CIPHER_CTX_get_num(in_RDI);
  local_38 = in_RSI;
  local_30 = in_RDX;
  if (iVar1 != 0) {
    iVar1 = EVP_CIPHER_CTX_get_num(in_RDI);
    ctx_00 = (void *)0x0;
    for (in_stack_ffffffffffffffb8 = (uchar *)(long)iVar1;
        in_stack_ffffffffffffffb8 < (uchar *)0x8 && ctx_00 < in_RCX;
        in_stack_ffffffffffffffb8 = in_stack_ffffffffffffffb8 + 1) {
      *local_38 = buf_00[(long)in_stack_ffffffffffffffb8] ^ *local_30;
      ctx_00 = (void *)((long)ctx_00 + 1);
      local_30 = local_30 + 1;
      local_38 = local_38 + 1;
    }
    if (in_stack_ffffffffffffffb8 != (uchar *)0x8) {
      EVP_CIPHER_CTX_set_num(in_RDI,(ulong)in_stack_ffffffffffffffb8 & 0xffffffff);
      return 1;
    }
    EVP_CIPHER_CTX_set_num(in_RDI,0);
  }
  for (; 7 < (ulong)((long)in_RCX - (long)ctx_00); ctx_00 = (void *)((long)ctx_00 + 8)) {
    EVP_CIPHER_CTX_get_cipher_data(in_RDI);
    gost_cnt_next(ctx_00,in_stack_ffffffffffffffb8,buf_00);
    for (in_stack_ffffffffffffffb8 = (uchar *)0x0; in_stack_ffffffffffffffb8 < (uchar *)0x8;
        in_stack_ffffffffffffffb8 = in_stack_ffffffffffffffb8 + 1) {
      local_38[(long)in_stack_ffffffffffffffb8] =
           buf_00[(long)in_stack_ffffffffffffffb8] ^ local_30[(long)in_stack_ffffffffffffffb8];
    }
    local_30 = local_30 + 8;
    local_38 = local_38 + 8;
  }
  if (ctx_00 < in_RCX) {
    EVP_CIPHER_CTX_get_cipher_data(in_RDI);
    gost_cnt_next(ctx_00,in_stack_ffffffffffffffb8,buf_00);
    uVar2 = 0;
    for (; ctx_00 < in_RCX; ctx_00 = (void *)((long)ctx_00 + 1)) {
      local_38[uVar2] = buf_00[uVar2] ^ local_30[uVar2];
      uVar2 = uVar2 + 1;
    }
    EVP_CIPHER_CTX_set_num(in_RDI,uVar2 & 0xffffffff);
  }
  else {
    EVP_CIPHER_CTX_set_num(in_RDI,0);
  }
  return 1;
}

Assistant:

static int gost_cipher_do_cnt(EVP_CIPHER_CTX *ctx, unsigned char *out,
                              const unsigned char *in, size_t inl)
{
    const unsigned char *in_ptr = in;
    unsigned char *out_ptr = out;
    size_t i = 0;
    size_t j;
    unsigned char *buf = EVP_CIPHER_CTX_buf_noconst(ctx);
    unsigned char *iv = EVP_CIPHER_CTX_iv_noconst(ctx);
/* process partial block if any */
    if (EVP_CIPHER_CTX_num(ctx)) {
        for (j = EVP_CIPHER_CTX_num(ctx), i = 0; j < 8 && i < inl;
             j++, i++, in_ptr++, out_ptr++) {
            *out_ptr = buf[j] ^ (*in_ptr);
        }
        if (j == 8) {
            EVP_CIPHER_CTX_set_num(ctx, 0);
        } else {
            EVP_CIPHER_CTX_set_num(ctx, j);
            return 1;
        }
    }

    for (; (inl - i) >= 8; i += 8, in_ptr += 8, out_ptr += 8) {
        /*
         * block cipher current iv
         */
        /* Encrypt */
        gost_cnt_next(EVP_CIPHER_CTX_get_cipher_data(ctx), iv, buf);
        /*
         * xor next block of input text with it and output it
         */
        /*
         * output this block
         */
        for (j = 0; j < 8; j++) {
            out_ptr[j] = buf[j] ^ in_ptr[j];
        }
    }
/* Process rest of buffer */
    if (i < inl) {
        gost_cnt_next(EVP_CIPHER_CTX_get_cipher_data(ctx), iv, buf);
        for (j = 0; i < inl; j++, i++) {
            out_ptr[j] = buf[j] ^ in_ptr[j];
        }
        EVP_CIPHER_CTX_set_num(ctx, j);
    } else {
        EVP_CIPHER_CTX_set_num(ctx, 0);
    }
    return 1;
}